

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle_p.h
# Opt level: O0

void __thiscall QCommonStylePrivate::~QCommonStylePrivate(QCommonStylePrivate *this)

{
  undefined8 *in_RDI;
  QHash<const_QObject_*,_QStyleAnimation_*> *unaff_retaddr;
  QStyleOptionViewItem *this_00;
  
  *in_RDI = &PTR__QCommonStylePrivate_00d0a020;
  qDeleteAll<QHash<QObject_const*,QStyleAnimation*>>(unaff_retaddr);
  this_00 = (QStyleOptionViewItem *)in_RDI[0x19];
  if (this_00 != (QStyleOptionViewItem *)0x0) {
    QStyleOptionViewItem::~QStyleOptionViewItem(this_00);
    operator_delete(this_00,0xd0);
  }
  QHash<const_QObject_*,_QStyleAnimation_*>::~QHash
            ((QHash<const_QObject_*,_QStyleAnimation_*> *)this_00);
  QIcon::~QIcon((QIcon *)(in_RDI + 0x1a));
  QStylePrivate::~QStylePrivate((QStylePrivate *)this_00);
  return;
}

Assistant:

~QCommonStylePrivate()
    {
#if QT_CONFIG(animation)
        qDeleteAll(animations);
#endif
#if QT_CONFIG(itemviews)
        delete cachedOption;
#endif
    }